

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<datarate_test::(anonymous_namespace)::DatarateTestSVC_BasicRateTargetingSVC3TL1SLDropSetEnhFrameER_Test>
::CreateTest(ParameterizedTestFactory<datarate_test::(anonymous_namespace)::DatarateTestSVC_BasicRateTargetingSVC3TL1SLDropSetEnhFrameER_Test>
             *this)

{
  DatarateTestSVC *this_00;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int,int>>
  ::parameter_ = &this->parameter_;
  this_00 = (DatarateTestSVC *)operator_new(0x18f0);
  datarate_test::anon_unknown_0::DatarateTestSVC::DatarateTestSVC(this_00);
  (this_00->super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__DatarateTestSVC_00f28610;
  (this_00->super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  .
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  ._vptr_WithParamInterface =
       (_func_int **)
       &PTR__DatarateTestSVC_BasicRateTargetingSVC3TL1SLDropSetEnhFrameER_Test_00f28828;
  (this_00->super_DatarateTest).super_EncoderTest._vptr_EncoderTest =
       (_func_int **)
       &PTR__DatarateTestSVC_BasicRateTargetingSVC3TL1SLDropSetEnhFrameER_Test_00f28848;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }